

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Value * __thiscall
ot::commissioner::Interpreter::ProcessStart
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  string *this_00;
  string *this_01;
  pointer pbVar1;
  ErrorCode EVar2;
  pointer pcVar3;
  pointer pbVar4;
  undefined4 uVar5;
  char *pcVar6;
  Status SVar7;
  long lVar8;
  char *pcVar9;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar10;
  Value *pVVar11;
  char cVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  char *pcVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  int iVar15;
  uint __len;
  bool bVar16;
  string_view fmt;
  string_view fmt_00;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  BorderRouterId rawid;
  string __str;
  CommissionerAppPtr commissioner;
  Expression expr;
  writer write;
  NetworkSelectionComparator guard;
  BorderRouter br;
  BorderRouterId local_444;
  undefined1 local_440 [8];
  _Alloc_hider local_438;
  char local_430 [8];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_428;
  _Alloc_hider local_418;
  size_type local_410;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_408;
  string local_3f8;
  CommissionerAppPtr local_3d8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_3c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_3b8;
  writer local_3a0;
  NetworkSelectionComparator local_398;
  undefined4 local_380;
  undefined1 *local_378;
  long local_370;
  undefined1 local_368 [16];
  format_string_checker<char> local_358;
  undefined4 local_320;
  undefined1 *local_318;
  long local_310;
  undefined1 local_308 [16];
  undefined4 local_2f8;
  undefined1 *local_2f0;
  long local_2e8;
  undefined1 local_2e0 [16];
  undefined4 local_2d0;
  undefined1 *local_2c8;
  long local_2c0;
  undefined1 local_2b8 [16];
  undefined4 local_2a8;
  undefined1 *local_2a0;
  long local_298;
  undefined1 local_290 [16];
  Error local_280;
  Error local_258;
  Error local_230;
  Error local_208;
  Error local_1e0;
  BorderRouter local_1b8;
  
  (__return_storage_ptr__->mError).mCode = kNone;
  paVar10 = &(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p = (pointer)paVar10;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  paVar14 = &(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_dataplus._M_p = (pointer)paVar14;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_3d8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_3d8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_3b8,aExpr);
  persistent_storage::BorderRouter::BorderRouter(&local_1b8);
  this_00 = &(__return_storage_ptr__->mError).mMessage;
  this_01 = &__return_storage_ptr__->mData;
  lVar8 = (long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(aExpr->
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start >> 5;
  if (lVar8 == 1) {
    SVar7 = persistent_storage::Registry::GetCurrentNetworkXpan
                      ((this->mRegistry).
                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,(uint64_t *)&local_398);
    if (SVar7 == kSuccess) {
      local_3c0 = paVar10;
      JobManager::GetSelectedCommissioner
                (&local_1e0,
                 (this->mJobManager).
                 super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                 ,&local_3d8);
      local_440._0_4_ = local_1e0.mCode;
      local_438._M_p = (pointer)&local_428;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_438,local_1e0.mMessage._M_dataplus._M_p,
                 local_1e0.mMessage._M_dataplus._M_p + local_1e0.mMessage._M_string_length);
      local_410 = 0;
      local_408._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_440._0_4_;
      local_418._M_p = (pointer)&local_408;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_438);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_418);
      EVar2 = (__return_storage_ptr__->mError).mCode;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_p != &local_408) {
        operator_delete(local_418._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_p != &local_428) {
        operator_delete(local_438._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0.mMessage._M_dataplus._M_p != &local_1e0.mMessage.field_2) {
        operator_delete(local_1e0.mMessage._M_dataplus._M_p);
      }
      cVar12 = '\x05';
      if (EVar2 == kNone) {
        JobManager::MakeBorderRouterChoice
                  (&local_208,
                   (this->mJobManager).
                   super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,(uint64_t)local_398.mInterpreter,&local_1b8);
        local_440._0_4_ = local_208.mCode;
        local_438._M_p = (pointer)&local_428;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_438,local_208.mMessage._M_dataplus._M_p,
                   local_208.mMessage._M_dataplus._M_p + local_208.mMessage._M_string_length);
        local_410 = 0;
        local_408._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_440._0_4_;
        local_418._M_p = (pointer)&local_408;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_438);
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_418);
        EVar2 = (__return_storage_ptr__->mError).mCode;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_p != &local_408) {
          operator_delete(local_418._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_p != &local_428) {
          operator_delete(local_438._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_208.mMessage._M_dataplus._M_p != &local_208.mMessage.field_2) {
          operator_delete(local_208.mMessage._M_dataplus._M_p);
        }
        if (EVar2 == kNone) {
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back(&local_3b8,&local_1b8.mAgent.mAddr);
          __len = 1;
          if (((9 < local_1b8.mAgent.mPort) && (__len = 2, 99 < local_1b8.mAgent.mPort)) &&
             (__len = 3, 999 < local_1b8.mAgent.mPort)) {
            __len = 5 - (local_1b8.mAgent.mPort < 10000);
          }
          local_440 = (undefined1  [8])local_430;
          std::__cxx11::string::_M_construct((ulong)local_440,(char)__len);
          std::__detail::__to_chars_10_impl<unsigned_int>
                    ((char *)local_440,__len,(uint)local_1b8.mAgent.mPort);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_3b8
                     ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440
                    );
          if (local_440 != (undefined1  [8])local_430) {
            operator_delete((void *)local_440);
          }
          cVar12 = '\x02';
        }
      }
    }
    else {
      local_358._0_8_ = local_358._0_8_ & 0xffffffff00000000;
      local_358.context_.super_basic_format_parse_context<char>.format_str_.data_ =
           "getting selected network failed";
      local_358.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x1f;
      local_358.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
      local_358.context_.super_basic_format_parse_context<char>._20_4_ = 0;
      local_358.parse_funcs_[0] = (parse_func)0x0;
      pcVar13 = "getting selected network failed";
      local_3c0 = paVar10;
      local_358.context_.types_ = local_358.types_;
      do {
        pcVar9 = pcVar13 + 1;
        if (*pcVar13 == '}') {
          if ((pcVar9 == "") || (*pcVar9 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar9 = pcVar13 + 2;
        }
        else if (*pcVar13 == '{') {
          pcVar9 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                             (pcVar13,"",&local_358);
        }
        pcVar13 = pcVar9;
      } while (pcVar9 != "");
      args_01.field_1.args_ = in_R9.args_;
      args_01.desc_ = (unsigned_long_long)&local_358;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_3f8,(v10 *)"getting selected network failed",(string_view)ZEXT816(0x1f),
                 args_01);
      local_380 = 0x12;
      local_378 = local_368;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_378,local_3f8._M_dataplus._M_p,
                 local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
      local_440._0_4_ = local_380;
      local_438._M_p = (pointer)&local_428;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_438,local_378,local_378 + local_370);
      local_410 = 0;
      local_408._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_440._0_4_;
      local_418._M_p = (pointer)&local_408;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_438);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_418);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_p != &local_408) {
        operator_delete(local_418._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_p != &local_428) {
        operator_delete(local_438._M_p);
      }
      if (local_378 != local_368) {
        operator_delete(local_378);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
        operator_delete(local_3f8._M_dataplus._M_p);
      }
      cVar12 = '\x05';
    }
LAB_00239237:
    if (cVar12 != '\x02') {
      if (cVar12 != '\x05') {
LAB_00239601:
        local_1b8._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_0039ff00;
        BorderAgent::~BorderAgent(&local_1b8.mAgent);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_3b8);
        if (local_3d8.
            super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_3d8.
                     super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        paVar10 = local_3c0;
        pcVar3 = (this_01->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 != paVar14) {
          operator_delete(pcVar3);
        }
        pcVar3 = (this_00->_M_dataplus)._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)pcVar3 == paVar10) {
          return __return_storage_ptr__;
        }
        operator_delete(pcVar3);
        return __return_storage_ptr__;
      }
      goto LAB_002396d5;
    }
LAB_0023966d:
    ProcessStartJob((Value *)local_440,this,&local_3d8,&local_3b8);
    (__return_storage_ptr__->mError).mCode = local_440._0_4_;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_438);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_418);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_p != &local_408) {
      operator_delete(local_418._M_p);
    }
    paVar10 = &local_428;
  }
  else {
    if (lVar8 == 2) {
      persistent_storage::BorderRouterId::BorderRouterId(&local_444);
      NetworkSelectionComparator::NetworkSelectionComparator(&local_398,this);
      utils::ParseInteger<unsigned_int>
                (&local_230,&local_444.mId,
                 local_3b8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + 1);
      local_440._0_4_ = local_230.mCode;
      local_438._M_p = (pointer)&local_428;
      local_3c0 = paVar10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_438,local_230.mMessage._M_dataplus._M_p,
                 local_230.mMessage._M_dataplus._M_p + local_230.mMessage._M_string_length);
      local_410 = 0;
      local_408._M_local_buf[0] = '\0';
      (__return_storage_ptr__->mError).mCode = local_440._0_4_;
      local_418._M_p = (pointer)&local_408;
      std::__cxx11::string::operator=((string *)this_00,(string *)&local_438);
      std::__cxx11::string::operator=((string *)this_01,(string *)&local_418);
      EVar2 = (__return_storage_ptr__->mError).mCode;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_418._M_p != &local_408) {
        operator_delete(local_418._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_438._M_p != &local_428) {
        operator_delete(local_438._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_230.mMessage._M_dataplus._M_p != &local_230.mMessage.field_2) {
        operator_delete(local_230.mMessage._M_dataplus._M_p);
      }
      iVar15 = 5;
      if (EVar2 == kNone) {
        SVar7 = persistent_storage::Registry::GetBorderRouter
                          ((this->mRegistry).
                           super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,local_444,&local_1b8);
        if (SVar7 == kSuccess) {
          SVar7 = persistent_storage::Registry::SetCurrentNetwork
                            ((this->mRegistry).
                             super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,&local_1b8);
          if (SVar7 == kSuccess) {
            UpdateNetworkSelectionInfo((Error *)local_440,this,false);
            uVar5 = local_440._0_4_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_p != &local_428) {
              operator_delete(local_438._M_p);
            }
            if (uVar5 == kNone) {
              JobManager::GetSelectedCommissioner
                        (&local_258,
                         (this->mJobManager).
                         super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,&local_3d8);
              local_440._0_4_ = local_258.mCode;
              local_438._M_p = (pointer)&local_428;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_438,local_258.mMessage._M_dataplus._M_p,
                         local_258.mMessage._M_dataplus._M_p + local_258.mMessage._M_string_length);
              local_410 = 0;
              local_408._M_local_buf[0] = '\0';
              local_418._M_p = (pointer)&local_408;
              pVVar11 = Value::operator=(__return_storage_ptr__,(Value *)local_440);
              EVar2 = (pVVar11->mError).mCode;
              Value::~Value((Value *)local_440);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_258.mMessage._M_dataplus._M_p != &local_258.mMessage.field_2) {
                operator_delete(local_258.mMessage._M_dataplus._M_p);
              }
              iVar15 = 5;
              if (EVar2 == kNone) {
                pbVar1 = local_3b8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1;
                pcVar3 = local_3b8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish[-1]._M_dataplus._M_p;
                pbVar4 = local_3b8.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish + -1;
                local_3b8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = pbVar1;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pcVar3 != &pbVar4->field_2) {
                  operator_delete(pcVar3);
                }
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(&local_3b8,&local_1b8.mAgent.mAddr);
                std::__cxx11::to_string((string *)local_440,(uint)local_1b8.mAgent.mPort);
                std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
                emplace_back<std::__cxx11::string>
                          ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                           &local_3b8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_440);
                if (local_440 != (undefined1  [8])local_430) {
                  operator_delete((void *)local_440);
                }
                iVar15 = 2;
              }
            }
          }
          else {
            local_358.types_[0] = uint_type;
            pcVar13 = "network selection failed for nwk[{}]";
            local_358.context_.super_basic_format_parse_context<char>.format_str_.data_ =
                 "network selection failed for nwk[{}]";
            local_358.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x24;
            local_358.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
            local_358.context_.super_basic_format_parse_context<char>._20_4_ = 1;
            local_358.parse_funcs_[0] =
                 ::fmt::v10::detail::
                 parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>;
            local_3c8 = paVar14;
            local_3a0.handler_ = &local_358;
            local_358.context_.types_ = local_358.types_;
            do {
              if (pcVar13 == "") break;
              pcVar9 = pcVar13;
              if (*pcVar13 == '{') {
LAB_00239485:
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_int>_>
                ::writer::operator()((writer *)&local_3a0,pcVar13,pcVar9);
                pcVar13 = ::fmt::v10::detail::
                          parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int>&>
                                    (pcVar9,"",&local_358);
                bVar16 = true;
              }
              else {
                pcVar9 = pcVar13 + 1;
                bVar16 = pcVar9 != "";
                if (bVar16) {
                  if (*pcVar9 != '{') {
                    pcVar6 = pcVar13 + 2;
                    do {
                      pcVar9 = pcVar6;
                      bVar16 = pcVar9 != "";
                      if (pcVar9 == "") goto LAB_00239481;
                      pcVar6 = pcVar9 + 1;
                    } while (*pcVar9 != '{');
                  }
                  bVar16 = true;
                }
LAB_00239481:
                if (bVar16) goto LAB_00239485;
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_unsigned_int>_>
                ::writer::operator()((writer *)&local_3a0,pcVar13,"");
                bVar16 = false;
              }
            } while (bVar16);
            local_358._0_8_ = ZEXT48(local_1b8.mNetworkId.mId);
            fmt_00.size_ = 2;
            fmt_00.data_ = (char *)0x24;
            args_03.field_1.args_ = in_R9.args_;
            args_03.desc_ = (unsigned_long_long)&local_358;
            ::fmt::v10::vformat_abi_cxx11_
                      (&local_3f8,(v10 *)"network selection failed for nwk[{}]",fmt_00,args_03);
            local_2d0 = 5;
            local_2c8 = local_2b8;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_2c8,local_3f8._M_dataplus._M_p,
                       local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
            local_440._0_4_ = local_2d0;
            local_438._M_p = (pointer)&local_428;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_438,local_2c8,local_2c8 + local_2c0);
            local_410 = 0;
            local_408._M_local_buf[0] = '\0';
            (__return_storage_ptr__->mError).mCode = local_440._0_4_;
            local_418._M_p = (pointer)&local_408;
            std::__cxx11::string::operator=((string *)this_00,(string *)&local_438);
            std::__cxx11::string::operator=((string *)this_01,(string *)&local_418);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_418._M_p != &local_408) {
              operator_delete(local_418._M_p);
            }
            iVar15 = 5;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_438._M_p != &local_428) {
              operator_delete(local_438._M_p);
            }
            if (local_2c8 != local_2b8) {
              operator_delete(local_2c8);
            }
            paVar14 = local_3c8;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) goto LAB_002395df;
          }
        }
        else {
          local_358.types_[0] = uint_type;
          local_358.context_.super_basic_format_parse_context<char>.format_str_.data_ =
               "br[{}] not found";
          local_358.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x10;
          local_358.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
          local_358.context_.super_basic_format_parse_context<char>._20_4_ = 1;
          local_358.parse_funcs_[0] =
               ::fmt::v10::detail::
               parse_format_specs<unsigned_int,fmt::v10::detail::compile_parse_context<char>>;
          pcVar13 = "br[{}] not found";
          local_358.context_.types_ = local_358.types_;
          do {
            pcVar9 = pcVar13 + 1;
            if (*pcVar13 == '}') {
              if ((pcVar9 == "") || (*pcVar9 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar9 = pcVar13 + 2;
            }
            else if (*pcVar13 == '{') {
              pcVar9 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,unsigned_int>&>
                                 (pcVar13,"",&local_358);
            }
            pcVar13 = pcVar9;
          } while (pcVar9 != "");
          local_358._0_8_ = ZEXT48(local_444.mId);
          fmt.size_ = 2;
          fmt.data_ = (char *)0x10;
          args_00.field_1.args_ = in_R9.args_;
          args_00.desc_ = (unsigned_long_long)&local_358;
          ::fmt::v10::vformat_abi_cxx11_(&local_3f8,(v10 *)"br[{}] not found",fmt,args_00);
          local_2a8 = 5;
          local_2a0 = local_290;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_2a0,local_3f8._M_dataplus._M_p,
                     local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
          local_440._0_4_ = local_2a8;
          local_438._M_p = (pointer)&local_428;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_438,local_2a0,local_2a0 + local_298);
          local_410 = 0;
          local_408._M_local_buf[0] = '\0';
          (__return_storage_ptr__->mError).mCode = local_440._0_4_;
          local_418._M_p = (pointer)&local_408;
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_438);
          std::__cxx11::string::operator=((string *)this_01,(string *)&local_418);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_p != &local_408) {
            operator_delete(local_418._M_p);
          }
          iVar15 = 5;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_p != &local_428) {
            operator_delete(local_438._M_p);
          }
          if (local_2a0 != local_290) {
            operator_delete(local_2a0);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
LAB_002395df:
            iVar15 = 5;
            operator_delete(local_3f8._M_dataplus._M_p);
          }
        }
      }
      NetworkSelectionComparator::~NetworkSelectionComparator(&local_398);
      if (iVar15 != 2) {
        if (iVar15 != 5) goto LAB_00239601;
        goto LAB_002396d5;
      }
      goto LAB_0023966d;
    }
    if (lVar8 == 3) {
      NetworkSelectionComparator::NetworkSelectionComparator(&local_398,this);
      SVar7 = persistent_storage::Registry::ForgetCurrentNetwork
                        ((this->mRegistry).
                         super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr);
      if (SVar7 == kSuccess) {
        local_3c0 = paVar10;
        UpdateNetworkSelectionInfo((Error *)local_440,this,false);
        uVar5 = local_440._0_4_;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_p != &local_428) {
          operator_delete(local_438._M_p);
        }
        cVar12 = '\x05';
        if (uVar5 == kNone) {
          JobManager::GetSelectedCommissioner
                    (&local_280,
                     (this->mJobManager).
                     super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,&local_3d8);
          local_440._0_4_ = local_280.mCode;
          local_438._M_p = (pointer)&local_428;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_438,local_280.mMessage._M_dataplus._M_p,
                     local_280.mMessage._M_dataplus._M_p + local_280.mMessage._M_string_length);
          local_410 = 0;
          local_408._M_local_buf[0] = '\0';
          (__return_storage_ptr__->mError).mCode = local_440._0_4_;
          local_418._M_p = (pointer)&local_408;
          std::__cxx11::string::operator=((string *)this_00,(string *)&local_438);
          std::__cxx11::string::operator=((string *)this_01,(string *)&local_418);
          EVar2 = (__return_storage_ptr__->mError).mCode;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_418._M_p != &local_408) {
            operator_delete(local_418._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_438._M_p != &local_428) {
            operator_delete(local_438._M_p);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_280.mMessage._M_dataplus._M_p != &local_280.mMessage.field_2) {
            operator_delete(local_280.mMessage._M_dataplus._M_p);
          }
          cVar12 = (EVar2 != kNone) * '\x03' + '\x02';
        }
      }
      else {
        local_358._0_8_ = local_358._0_8_ & 0xffffffff00000000;
        pcVar13 = "failed to drop network selection";
        local_358.context_.super_basic_format_parse_context<char>.format_str_.data_ =
             "failed to drop network selection";
        local_358.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x20;
        local_358.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
        local_358.context_.super_basic_format_parse_context<char>._20_4_ = 0;
        local_358.parse_funcs_[0] = (parse_func)0x0;
        local_3c8 = paVar14;
        local_3c0 = paVar10;
        local_3a0.handler_ = &local_358;
        local_358.context_.types_ = local_358.types_;
        do {
          if (pcVar13 == "") break;
          pcVar9 = pcVar13;
          if (*pcVar13 == '{') {
LAB_00238902:
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&local_3a0,pcVar13,pcVar9);
            pcVar13 = ::fmt::v10::detail::
                      parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                                (pcVar9,"",&local_358);
            bVar16 = true;
          }
          else {
            pcVar9 = pcVar13 + 1;
            bVar16 = pcVar9 != "";
            if (bVar16) {
              if (*pcVar9 != '{') {
                pcVar6 = pcVar13 + 2;
                do {
                  pcVar9 = pcVar6;
                  bVar16 = pcVar9 != "";
                  if (pcVar9 == "") goto LAB_002388fe;
                  pcVar6 = pcVar9 + 1;
                } while (*pcVar9 != '{');
              }
              bVar16 = true;
            }
LAB_002388fe:
            if (bVar16) goto LAB_00238902;
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char>_>::writer
            ::operator()(&local_3a0,pcVar13,"");
            bVar16 = false;
          }
        } while (bVar16);
        args.field_1.args_ = in_R9.args_;
        args.desc_ = (unsigned_long_long)&local_358;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_3f8,(v10 *)"failed to drop network selection",(string_view)ZEXT816(0x20),
                   args);
        local_2f8 = 0x12;
        local_2f0 = local_2e0;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_2f0,local_3f8._M_dataplus._M_p,
                   local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
        local_440._0_4_ = local_2f8;
        local_438._M_p = (pointer)&local_428;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_438,local_2f0,local_2f0 + local_2e8);
        local_410 = 0;
        local_408._M_local_buf[0] = '\0';
        (__return_storage_ptr__->mError).mCode = local_440._0_4_;
        local_418._M_p = (pointer)&local_408;
        std::__cxx11::string::operator=((string *)this_00,(string *)&local_438);
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_418);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_418._M_p != &local_408) {
          operator_delete(local_418._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_438._M_p != &local_428) {
          operator_delete(local_438._M_p);
        }
        paVar14 = local_3c8;
        if (local_2f0 != local_2e0) {
          operator_delete(local_2f0);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_3f8._M_dataplus._M_p != &local_3f8.field_2) {
          operator_delete(local_3f8._M_dataplus._M_p);
        }
        cVar12 = '\x05';
      }
      NetworkSelectionComparator::~NetworkSelectionComparator(&local_398);
      goto LAB_00239237;
    }
    local_358._0_8_ = local_358._0_8_ & 0xffffffff00000000;
    local_358.context_.super_basic_format_parse_context<char>.format_str_.data_ =
         "too many arguments";
    local_358.context_.super_basic_format_parse_context<char>.format_str_.size_ = 0x12;
    local_358.context_.super_basic_format_parse_context<char>.next_arg_id_ = 0;
    local_358.context_.super_basic_format_parse_context<char>._20_4_ = 0;
    local_358.parse_funcs_[0] = (parse_func)0x0;
    pcVar13 = "too many arguments";
    local_358.context_.types_ = local_358.types_;
    do {
      pcVar9 = pcVar13 + 1;
      if (*pcVar13 == '}') {
        if ((pcVar9 == "") || (*pcVar9 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar9 = pcVar13 + 2;
      }
      else if (*pcVar13 == '{') {
        pcVar9 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar13,"",&local_358);
      }
      pcVar13 = pcVar9;
    } while (pcVar9 != "");
    args_02.field_1.args_ = in_R9.args_;
    args_02.desc_ = (unsigned_long_long)&local_358;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_3f8,(v10 *)"too many arguments",(string_view)ZEXT816(0x12),args_02);
    local_320 = 3;
    local_318 = local_308;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_318,local_3f8._M_dataplus._M_p,
               local_3f8._M_dataplus._M_p + local_3f8._M_string_length);
    local_440._0_4_ = local_320;
    local_438._M_p = (pointer)&local_428;
    std::__cxx11::string::_M_construct<char*>((string *)&local_438,local_318,local_318 + local_310);
    local_410 = 0;
    local_408._M_local_buf[0] = '\0';
    (__return_storage_ptr__->mError).mCode = local_440._0_4_;
    local_418._M_p = (pointer)&local_408;
    std::__cxx11::string::operator=((string *)this_00,(string *)&local_438);
    std::__cxx11::string::operator=((string *)this_01,(string *)&local_418);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_418._M_p != &local_408) {
      operator_delete(local_418._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_438._M_p != &local_428) {
      operator_delete(local_438._M_p);
    }
    if (local_318 != local_308) {
      operator_delete(local_318);
    }
    paVar10 = &local_3f8.field_2;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*(undefined1 **)(paVar10->_M_local_buf + -0x10) != paVar10) {
    operator_delete(*(undefined1 **)(paVar10->_M_local_buf + -0x10));
  }
LAB_002396d5:
  local_1b8._vptr_BorderRouter = (_func_int **)&PTR__BorderRouter_0039ff00;
  BorderAgent::~BorderAgent(&local_1b8.mAgent);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_3b8);
  if (local_3d8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_3d8.
               super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessStart(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;
    Expression         expr         = aExpr;
    BorderRouter       br;

    switch (aExpr.size())
    {
    case 1:
    {
        // starting currently selected network
        uint64_t       nid;
        RegistryStatus status = mRegistry->GetCurrentNetworkXpan(nid);
        VerifyOrExit(status == RegistryStatus::kSuccess,
                     value = ERROR_REGISTRY_ERROR("getting selected network failed"));
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        SuccessOrExit(value = mJobManager->MakeBorderRouterChoice(nid, br));
        expr.push_back(br.mAgent.mAddr);
        expr.push_back(std::to_string(br.mAgent.mPort));
        break;
    }
    case 2:
    {
        // starting newtork by br raw id (experimental, for dev tests only)
        persistent_storage::BorderRouterId rawid;
        NetworkSelectionComparator         guard(*this);

        SuccessOrExit(value = ParseInteger(rawid.mId, expr[1]));
        VerifyOrExit(mRegistry->GetBorderRouter(rawid, br) == RegistryStatus::kSuccess,
                     value = ERROR_NOT_FOUND("br[{}] not found", rawid.mId));
        VerifyOrExit(mRegistry->SetCurrentNetwork(br) == RegistryStatus::kSuccess,
                     value = ERROR_NOT_FOUND("network selection failed for nwk[{}]", br.mNetworkId.mId));
        SuccessOrExit(UpdateNetworkSelectionInfo());
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        expr.pop_back();
        expr.push_back(br.mAgent.mAddr);
        expr.push_back(std::to_string(br.mAgent.mPort));
        break;
    }
    case 3:
    {
        NetworkSelectionComparator guard(*this);

        // starting network with explicit br_addr and br_port
        VerifyOrExit(mRegistry->ForgetCurrentNetwork() == RegistryStatus::kSuccess,
                     value = ERROR_REGISTRY_ERROR("failed to drop network selection"));
        SuccessOrExit(UpdateNetworkSelectionInfo());
        SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
        break;
    }
    default:
        ExitNow(value = ERROR_INVALID_COMMAND(SYNTAX_MANY_ARGS));
    }

    value = ProcessStartJob(commissioner, expr);
exit:
    return value;
}